

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

RankPreservingReshapeLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_rankpreservingreshape(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x47e) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x47e;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x28);
    RankPreservingReshapeLayerParams::RankPreservingReshapeLayerParams
              (this_00.rankpreservingreshape_);
    (this->layer_).rankpreservingreshape_ = (RankPreservingReshapeLayerParams *)this_00;
  }
  return (RankPreservingReshapeLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::RankPreservingReshapeLayerParams* NeuralNetworkLayer::mutable_rankpreservingreshape() {
  if (!has_rankpreservingreshape()) {
    clear_layer();
    set_has_rankpreservingreshape();
    layer_.rankpreservingreshape_ = new ::CoreML::Specification::RankPreservingReshapeLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.rankPreservingReshape)
  return layer_.rankpreservingreshape_;
}